

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O0

bool __thiscall DIS::IntercomSignalPdu::operator==(IntercomSignalPdu *this,IntercomSignalPdu *rhs)

{
  bool bVar1;
  bool ivarsEqual;
  IntercomSignalPdu *rhs_local;
  IntercomSignalPdu *this_local;
  
  RadioCommunicationsFamilyPdu::operator==
            (&this->super_RadioCommunicationsFamilyPdu,&rhs->super_RadioCommunicationsFamilyPdu);
  EntityID::operator==(&this->_entityID,&rhs->_entityID);
  bVar1 = std::operator==(&this->_data,&rhs->_data);
  return bVar1;
}

Assistant:

bool IntercomSignalPdu::operator==(const IntercomSignalPdu &rhs) const {
  bool ivarsEqual = true;

  ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

  if (!(_entityID == rhs._entityID))
    ivarsEqual = false;
  if (!(_communicationsDeviceID == rhs._communicationsDeviceID))
    ivarsEqual = false;
  if (!(_encodingScheme == rhs._encodingScheme))
    ivarsEqual = false;
  if (!(_tdlType == rhs._tdlType))
    ivarsEqual = false;
  if (!(_sampleRate == rhs._sampleRate))
    ivarsEqual = false;
  if (!(_samples == rhs._samples))
    ivarsEqual = false;

  ivarsEqual = (_data == rhs._data);

  return ivarsEqual;
}